

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

TValue * gc_step_jit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  int iVar1;
  int iVar2;
  
  *(undefined8 *)((long)L->cframe + 0x10) = 0xfff00240;
  iVar2 = (int)ud + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return (TValue *)0x0;
    }
    iVar1 = lj_gc_step(L);
  } while (iVar1 == 0);
  return (TValue *)0x0;
}

Assistant:

static TValue *gc_step_jit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  MSize steps = (MSize)(uintptr_t)ud;
  UNUSED(dummy);

  /* Always catch error here and don't call error function. */
  cframe_errfunc(L->cframe) = 0;
  cframe_nres(L->cframe) = -2*LUAI_MAXSTACK*(int)sizeof(TValue);

  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;

  return NULL;
}